

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

range_pair * __thiscall
srell::regex_internal::re_character_class::charclasspos(re_character_class *this,uint no)

{
  range_pair *prVar1;
  uchar21 uVar2;
  range_pair *outpair;
  range_pair *prVar3;
  
  prVar1 = (this->char_class_pos_).buffer_ + no;
  uVar2 = prVar1->second;
  prVar3 = prVar1;
  if ((8 < (uint)uVar2) &&
     (prVar3 = (this->char_class_pos_el_).buffer_ + no, prVar3->second == L'\0')) {
    prVar3->first = (uchar21)(this->char_class_el_).rparray_.size_;
    uVar2 = range_pairs::create_el
                      (&this->char_class_el_,
                       (this->char_class_).rparray_.buffer_ + (uint)prVar1->first,uVar2);
    prVar3->second = uVar2;
  }
  return prVar3;
}

Assistant:

const range_pair &charclasspos(const unsigned int no)	//  const
	{
		if (char_class_pos_[no].second <= lsearch_maxranges_)
			return char_class_pos_[no];
		else
		{
			const range_pair &pos = char_class_pos_el_[no];

			if (pos.second == 0)
				finalise(no);
			return pos;
		}
	}